

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O0

void __thiscall
ncnn::Deconvolution_x86_avx512::Deconvolution_x86_avx512(Deconvolution_x86_avx512 *this)

{
  undefined8 *in_RDI;
  Deconvolution *in_stack_fffffffffffffff8;
  
  Deconvolution::Deconvolution(in_stack_fffffffffffffff8);
  *in_RDI = &PTR__Deconvolution_x86_avx512_020186a8;
  in_RDI[0x41] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x43] = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  in_RDI[0x45] = 0;
  *(undefined4 *)(in_RDI + 0x46) = 0;
  *(undefined4 *)((long)in_RDI + 0x234) = 0;
  *(undefined4 *)(in_RDI + 0x47) = 0;
  *(undefined4 *)((long)in_RDI + 0x23c) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  in_RDI[0x49] = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 1;
  in_RDI[0x3f] = 0;
  in_RDI[0x40] = 0;
  return;
}

Assistant:

Deconvolution_x86_avx512::Deconvolution_x86_avx512()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    gemm = 0;
}